

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct_x86_fma::create_pipeline(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint _h;
  void *pvVar13;
  size_t sVar14;
  int *piVar15;
  Allocator *pAVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  int iVar23;
  uint _w;
  Layer *pLVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  char cVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  undefined4 *puVar39;
  long lVar40;
  undefined4 *puVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  ParamDict pd;
  long local_130;
  long local_120;
  long local_118;
  long local_e0;
  Mat local_c8;
  long local_78;
  void *local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar24 = create_layer_cpu(0xe);
  this->flatten = pLVar24;
  ParamDict::ParamDict((ParamDict *)&local_c8);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_c8);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_c8);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar23 = cpu_support_x86_f16c();
    if ((iVar23 == 0) || (opt->use_fp16_storage != true)) {
      _h = (this->super_InnerProduct).num_output;
      _w = (this->super_InnerProduct).weight_data_size / (int)_h;
      cVar28 = '\x01';
      if (opt->use_packing_layout == true) {
        cVar28 = '\b';
        if ((_h & 7) != 0) {
          cVar28 = ((_h & 3) == 0) * '\x03' + '\x01';
        }
      }
      this_00 = &(this->super_InnerProduct).weight_data;
      this_01 = &this->weight_data_tm;
      if (cVar28 == '\x01') {
        piVar15 = (this->super_InnerProduct).weight_data.refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        piVar15 = (this->weight_data_tm).refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            pvVar13 = (this->weight_data_tm).data;
            pAVar16 = (this->weight_data_tm).allocator;
            if (pAVar16 == (Allocator *)0x0) {
              if (pvVar13 != (void *)0x0) {
                free(pvVar13);
              }
            }
            else {
              (*pAVar16->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        this_01->data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        piVar15 = (this->super_InnerProduct).weight_data.refcount;
        (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
        (this->weight_data_tm).refcount = piVar15;
        (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
        (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
        (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
        iVar23 = (this->super_InnerProduct).weight_data.w;
        iVar21 = (this->super_InnerProduct).weight_data.h;
        iVar22 = (this->super_InnerProduct).weight_data.d;
        (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
        (this->weight_data_tm).w = iVar23;
        (this->weight_data_tm).h = iVar21;
        (this->weight_data_tm).d = iVar22;
        (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
        (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
      }
      else if (cVar28 == '\x04') {
        Mat::reshape(&local_c8,this_00,_w,_h,(Allocator *)0x0);
        uVar30 = _h + 3;
        if (-1 < (int)_h) {
          uVar30 = _h;
        }
        Mat::create(this_01,_w,(int)uVar30 >> 2,0x10,4,(Allocator *)0x0);
        if (3 < (int)_h) {
          local_120._0_4_ = _w & 0xfffffffc;
          lVar36 = 3;
          lVar35 = 2;
          local_130 = 1;
          local_118 = 0;
          uVar31 = 0;
          do {
            lVar38 = (long)(this->weight_data_tm).w;
            pvVar13 = (this->weight_data_tm).data;
            sVar14 = (this->weight_data_tm).elemsize;
            puVar41 = (undefined4 *)((uVar31 >> 2) * lVar38 * sVar14 + (long)pvVar13);
            lVar37 = (long)local_c8.w;
            if ((int)_w < 4) {
              lVar37 = local_c8.elemsize * lVar37;
              lVar32 = lVar37 * uVar31;
              lVar29 = (uVar31 | 1) * lVar37;
              lVar45 = (uVar31 | 2) * lVar37;
              lVar40 = lVar37 * (uVar31 | 3);
              uVar30 = 0;
            }
            else {
              lVar40 = local_c8.elemsize * lVar36 * lVar37;
              lVar45 = local_c8.elemsize * lVar35 * lVar37;
              lVar29 = local_c8.elemsize * local_130 * lVar37;
              lVar37 = local_c8.elemsize * uVar31 * lVar37;
              iVar23 = 3;
              lVar32 = 0;
              do {
                puVar39 = puVar41;
                auVar1 = *(undefined1 (*) [16])((long)local_c8.data + lVar32 + lVar37);
                auVar2 = *(undefined1 (*) [16])((long)local_c8.data + lVar32 + lVar29);
                auVar3 = *(undefined1 (*) [16])((long)local_c8.data + lVar32 + lVar45);
                auVar4 = *(undefined1 (*) [16])((long)local_c8.data + lVar32 + lVar40);
                auVar18 = vunpcklps_avx(auVar1,auVar2);
                auVar19 = vunpcklps_avx(auVar3,auVar4);
                auVar17 = vunpckhps_avx(auVar1,auVar2);
                auVar4 = vunpckhps_avx(auVar3,auVar4);
                auVar1 = vmovlhps_avx(auVar18,auVar19);
                auVar3 = vunpckhpd_avx(auVar18,auVar19);
                auVar2 = vmovlhps_avx(auVar17,auVar4);
                auVar4 = vunpckhpd_avx(auVar17,auVar4);
                puVar41 = (undefined4 *)
                          ((long)pvVar13 + lVar32 * 4 + sVar14 * local_118 * lVar38 + 0x40);
                *(undefined1 (*) [16])(puVar41 + -0x10) = auVar1;
                *(undefined1 (*) [16])(puVar41 + -0xc) = auVar3;
                *(undefined1 (*) [16])(puVar41 + -8) = auVar2;
                *(undefined1 (*) [16])(puVar41 + -4) = auVar4;
                iVar23 = iVar23 + 4;
                lVar32 = lVar32 + 0x10;
              } while (iVar23 < (int)_w);
              puVar41 = puVar39 + 0x10;
              lVar40 = lVar40 + lVar32;
              lVar45 = lVar45 + lVar32;
              lVar29 = lVar29 + lVar32;
              lVar32 = lVar37 + lVar32;
              uVar30 = (uint)local_120;
            }
            if ((int)uVar30 < (int)_w) {
              lVar37 = 0;
              do {
                *puVar41 = *(undefined4 *)((long)local_c8.data + lVar37 * 4 + lVar32);
                puVar41[1] = *(undefined4 *)((long)local_c8.data + lVar37 * 4 + lVar29);
                puVar41[2] = *(undefined4 *)((long)local_c8.data + lVar37 * 4 + lVar45);
                puVar41[3] = *(undefined4 *)((long)local_c8.data + lVar37 * 4 + lVar40);
                puVar41 = puVar41 + 4;
                lVar37 = lVar37 + 1;
              } while (_w - uVar30 != (int)lVar37);
            }
            uVar34 = uVar31 + 7;
            lVar36 = lVar36 + 4;
            lVar35 = lVar35 + 4;
            local_130 = local_130 + 4;
            local_118 = local_118 + 1;
            uVar31 = uVar31 + 4;
          } while (uVar34 < _h);
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (cVar28 == '\b') {
        Mat::reshape(&local_c8,this_00,_w,_h,(Allocator *)0x0);
        uVar30 = _h + 7;
        if (-1 < (int)_h) {
          uVar30 = _h;
        }
        Mat::create(this_01,_w,(int)uVar30 >> 3,0x20,8,(Allocator *)0x0);
        if (7 < (int)_h) {
          lVar35 = 1;
          lVar36 = 2;
          lVar37 = 7;
          lVar38 = 6;
          lVar40 = 5;
          local_120 = 4;
          local_e0 = 3;
          lVar45 = 0;
          uVar31 = 0;
          do {
            lVar29 = (long)(this->weight_data_tm).w;
            pvVar13 = (this->weight_data_tm).data;
            sVar14 = (this->weight_data_tm).elemsize;
            puVar41 = (undefined4 *)((uVar31 >> 3) * lVar29 * sVar14 + (long)pvVar13);
            lVar32 = (long)local_c8.w;
            if ((int)_w < 8) {
              lVar32 = local_c8.elemsize * lVar32;
              lVar29 = lVar32 * uVar31;
              lVar42 = (uVar31 | 1) * lVar32;
              lVar27 = (uVar31 | 2) * lVar32;
              lVar33 = (uVar31 | 3) * lVar32;
              lVar26 = (uVar31 | 4) * lVar32;
              lVar25 = (uVar31 | 5) * lVar32;
              lVar44 = (uVar31 | 6) * lVar32;
              lVar43 = lVar32 * (uVar31 | 7);
              uVar30 = 0;
            }
            else {
              lVar29 = sVar14 * lVar45 * lVar29;
              local_58 = local_c8.elemsize * uVar31 * lVar32;
              local_60 = local_c8.elemsize * lVar35 * lVar32;
              local_68 = local_c8.elemsize * lVar36 * lVar32;
              local_78 = local_c8.elemsize * lVar37 * lVar32;
              lVar44 = local_c8.elemsize * lVar38 * lVar32;
              lVar25 = local_c8.elemsize * lVar40 * lVar32;
              lVar26 = local_c8.elemsize * local_120 * lVar32;
              lVar32 = local_c8.elemsize * local_e0 * lVar32;
              local_70 = local_c8.data;
              iVar23 = 7;
              lVar33 = 0;
              do {
                auVar5 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + local_58);
                auVar6 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + local_60);
                auVar7 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + local_68);
                auVar8 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + lVar32);
                auVar9 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + lVar26);
                auVar10 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + lVar25);
                auVar11 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + lVar44);
                auVar12 = *(undefined1 (*) [32])((long)local_c8.data + lVar33 + local_78);
                auVar20 = vunpcklps_avx(auVar5,auVar6);
                auVar6 = vunpckhps_avx(auVar5,auVar6);
                auVar5 = vunpcklps_avx(auVar7,auVar8);
                auVar7 = vunpckhps_avx(auVar7,auVar8);
                auVar46 = vunpcklps_avx(auVar9,auVar10);
                auVar8 = vunpckhps_avx(auVar9,auVar10);
                auVar47 = vunpcklps_avx(auVar11,auVar12);
                auVar9 = vunpckhps_avx(auVar11,auVar12);
                auVar10 = vunpcklpd_avx(auVar20,auVar5);
                auVar5 = vunpckhpd_avx(auVar20,auVar5);
                auVar11 = vunpcklpd_avx(auVar6,auVar7);
                auVar6 = vunpckhpd_avx(auVar6,auVar7);
                auVar12 = vunpcklpd_avx(auVar46,auVar47);
                auVar7 = vunpckhpd_avx(auVar46,auVar47);
                auVar20 = vunpcklpd_avx(auVar8,auVar9);
                auVar8 = vunpckhpd_avx(auVar8,auVar9);
                auVar46._16_16_ = auVar12._0_16_;
                auVar46._0_16_ = auVar10._0_16_;
                auVar47._16_16_ = auVar7._0_16_;
                auVar47._0_16_ = auVar5._0_16_;
                auVar48._16_16_ = auVar20._0_16_;
                auVar48._0_16_ = auVar11._0_16_;
                auVar49._16_16_ = auVar8._0_16_;
                auVar49._0_16_ = auVar6._0_16_;
                auVar9 = vperm2f128_avx(auVar10,auVar12,0x31);
                auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
                auVar7 = vperm2f128_avx(auVar11,auVar20,0x31);
                auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29) = auVar46;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0x20) = auVar47;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0x40) = auVar48;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0x60) = auVar49;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0x80) = auVar9;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0xa0) = auVar5;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0xc0) = auVar7;
                *(undefined1 (*) [32])((long)pvVar13 + lVar33 * 8 + lVar29 + 0xe0) = auVar6;
                puVar41 = puVar41 + 0x40;
                lVar33 = lVar33 + 0x20;
                iVar23 = iVar23 + 8;
              } while (iVar23 < (int)_w);
              lVar29 = local_58 + lVar33;
              lVar42 = local_60 + lVar33;
              lVar27 = local_68 + lVar33;
              lVar43 = local_78 + lVar33;
              lVar44 = lVar44 + lVar33;
              lVar25 = lVar25 + lVar33;
              lVar26 = lVar26 + lVar33;
              lVar33 = lVar32 + lVar33;
              uVar30 = _w & 0xfffffff8;
              local_50 = uVar31;
              local_48 = lVar38;
              local_40 = lVar36;
              local_38 = lVar35;
            }
            if ((int)uVar30 < (int)_w) {
              lVar32 = 0;
              do {
                *puVar41 = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar29);
                puVar41[1] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar42);
                puVar41[2] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar27);
                puVar41[3] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar33);
                puVar41[4] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar26);
                puVar41[5] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar25);
                puVar41[6] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar44);
                puVar41[7] = *(undefined4 *)((long)local_c8.data + lVar32 * 4 + lVar43);
                puVar41 = puVar41 + 8;
                lVar32 = lVar32 + 1;
              } while (_w - uVar30 != (int)lVar32);
            }
            uVar34 = uVar31 + 0xf;
            lVar45 = lVar45 + 1;
            lVar35 = lVar35 + 8;
            lVar36 = lVar36 + 8;
            lVar37 = lVar37 + 8;
            lVar38 = lVar38 + 8;
            lVar40 = lVar40 + 8;
            local_120 = local_120 + 8;
            local_e0 = local_e0 + 8;
            uVar31 = uVar31 + 8;
          } while (uVar34 < _h);
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        piVar15 = (this->super_InnerProduct).weight_data.refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            pvVar13 = (this->super_InnerProduct).weight_data.data;
            pAVar16 = (this->super_InnerProduct).weight_data.allocator;
            if (pAVar16 == (Allocator *)0x0) {
              if (pvVar13 != (void *)0x0) {
                free(pvVar13);
              }
            }
            else {
              (*pAVar16->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_InnerProduct).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
        this_00->data = (void *)0x0;
        (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
        (this->super_InnerProduct).weight_data.dims = 0;
        (this->super_InnerProduct).weight_data.w = 0;
        (this->super_InnerProduct).weight_data.h = 0;
        (this->super_InnerProduct).weight_data.d = 0;
        (this->super_InnerProduct).weight_data.c = 0;
      }
    }
    else {
      create_pipeline_fp16s(this,opt);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}